

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl-read.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  FILE *__stream;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  tmidl_parser_o *parser;
  tmidl_callbacks_i callbacks;
  tmidl_callbacks_i local_48;
  
  if (argc < 2) {
    printf("File to read not specified!");
  }
  else {
    if (argc == 2) {
      __stream = fopen(argv[1],"rb");
      if (__stream == (FILE *)0x0) {
        pcVar2 = "Failed to open target file!";
      }
      else {
        fseek(__stream,0,2);
        __n = ftell(__stream);
        fseek(__stream,0,0);
        pcVar2 = (char *)malloc(__n + 1);
        fread(pcVar2,1,__n,__stream);
        fclose(__stream);
        pcVar2[__n] = '\0';
        if (__n != 0) {
          sVar3 = 0;
          do {
            if (pcVar2[sVar3] == '\0') {
              printf("File contained null, not allowed.");
              free(pcVar2);
              return 1;
            }
            sVar3 = sVar3 + 1;
          } while (__n != sVar3);
        }
        local_48.on_diagnostic = on_diagnostic;
        local_48.on_declaration = on_declaration;
        local_48.on_module_doc = on_module_doc;
        parser = tmidl_parser_create();
        _Var1 = tmidl_parser_parse(parser,pcVar2,&local_48,(void *)0x0);
        tmidl_parser_destroy(parser);
        free(pcVar2);
        if (_Var1) {
          return 0;
        }
        pcVar2 = "Parsing failed!";
      }
    }
    else {
      pcVar2 = "Too many arguments!";
    }
    puts(pcVar2);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 2) {
        printf("File to read not specified!");
        return 1;
    }
    if (argc > 2) {
        printf("Too many arguments!\n");
        return 1;
    }

    FILE *file = fopen(argv[1], "rb");
    if (file == NULL) {
        printf("Failed to open target file!\n");
        return 1;
    }

    // Find the size of the file
    fseek(file, 0, SEEK_END);
    size_t size = ftell(file);
    fseek(file, 0, SEEK_SET);

    // Read the entire file to memory
    char *data = malloc(size + 1);
    fread(data, 1, size, file);
    fclose(file);
    data[size] = 0;

    // Validate the file did not contain any nulls, as those make the string invalid
    for (size_t i = 0; i < size; i++) {
        if (data[i] == 0) {
            printf("File contained null, not allowed.");
            free(data);
            return 1;
        }
    }

    // Parse the file
    tmidl_callbacks_i callbacks = {
        .on_declaration = on_declaration,
        .on_module_doc = on_module_doc,
        .on_diagnostic = on_diagnostic
    };
    tmidl_parser_o *parser = tmidl_parser_create();
    bool success = tmidl_parser_parse(parser, data, &callbacks, NULL);
    tmidl_parser_destroy(parser);
    free(data);

    if (!success) {
        printf("Parsing failed!\n");
        return 1;
    }

    return 0;
}